

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O3

void __thiscall level_tools::push_ext_meshes(level_tools *this,level_mesh *mesh)

{
  cse_abstract *pcVar1;
  pointer ppxVar2;
  pointer ppxVar3;
  uint16_t sector_idx;
  uint16_t uVar4;
  uint16_t uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  xr_gamemtl *pxVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  shape_def_vec *psVar10;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  pointer ppcVar11;
  size_t hint;
  size_t hint_00;
  pointer pcVar12;
  char *format;
  pointer ppxVar13;
  pointer ppcVar14;
  pointer ppcVar15;
  xr_ogf *pxVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  pointer local_b0;
  anon_union_64_4_b9f67276_for__matrix<float>_1 local_90;
  xr_level_spawn *local_50;
  ulong local_48;
  pointer local_40;
  cse_abstract *local_38;
  
  if (this->m_level->m_spawn != (xr_level_spawn *)0x0) {
    pxVar9 = xray_re::xr_gamemtls_lib::get_material(this->m_gamemtls_lib,this->m_ladders_gamemtl);
    if (pxVar9 == (xr_gamemtl *)0x0) {
      __assert_fail("gamemtl",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                    ,0x172,"void level_tools::push_ext_meshes(level_mesh *)");
    }
    local_50 = this->m_level->m_spawn;
    ppcVar14 = (local_50->m_spawns).
               super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppcVar11 = (local_50->m_spawns).
               super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar14 != ppcVar11) {
      hint = ((long)(this->m_textures->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_textures->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
      hint_00 = ((long)(this->m_shaders->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_shaders->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
      local_b0 = (this->m_level->m_brkbl_meshes).
                 super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_48 = (ulong)(ushort)pxVar9->id;
      ppcVar15 = ppcVar14;
      local_40 = ppcVar11;
      do {
        pcVar1 = *ppcVar15;
        iVar6 = std::__cxx11::string::compare((char *)&pcVar1->m_s_name);
        if (iVar6 == 0) {
          pxVar16 = *local_b0;
          local_b0 = local_b0 + 1;
LAB_001395ec:
          fVar20 = (pcVar1->m_o_angle).field_0.field_0.x;
          fVar18 = (pcVar1->m_o_angle).field_0.field_0.y;
          fVar22 = (pcVar1->m_o_angle).field_0.field_0.z;
          fVar17 = sinf(fVar18);
          fVar18 = cosf(fVar18);
          fVar19 = sinf(fVar20);
          fVar20 = cosf(fVar20);
          fVar21 = sinf(fVar22);
          fVar22 = cosf(fVar22);
          local_90.field_0._11 = fVar18 * fVar22 - fVar21 * fVar17 * fVar19;
          local_90.field_0._12 = fVar21 * -fVar20;
          local_90.field_0._21 = fVar17 * fVar19 * fVar22 + fVar18 * fVar21;
          local_90.field_0._13 = fVar18 * fVar21 * fVar19 + fVar17 * fVar22;
          local_90.field_0._14 = 0.0;
          local_90.field_0._22 = fVar20 * fVar22;
          local_90.field_0._23 = fVar21 * fVar17 - fVar18 * fVar19 * fVar22;
          local_90.field_0._24 = 0.0;
          local_90.field_0._31 = -fVar20 * fVar17;
          local_90.field_0._33 = fVar18 * fVar20;
          local_90.field_0._34 = 0.0;
          local_90.field_0._44 = 1.0;
          local_90._48_8_ = *(undefined8 *)&(pcVar1->m_o_position).field_0;
          local_90.field_0._43 = (pcVar1->m_o_position).field_0.field_0.z;
          local_90.field_0._32 = fVar19;
          sector_idx = get_sector_idx(this,&pcVar1->m_o_position);
          local_38 = pcVar1;
          if (pxVar16 == (xr_ogf *)0x0) {
            iVar6 = (*pcVar1->_vptr_cse_abstract[7])();
            psVar10 = xray_re::cse_shape::shapes((cse_shape *)CONCAT44(extraout_var_03,iVar6));
            level_mesh::push(mesh,sector_idx,
                             (psVar10->
                             super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>
                             )._M_impl.super__Vector_impl_data._M_start,(fmatrix *)&local_90.field_0
                             ,0,0,(uint16_t)local_48);
LAB_001399c9:
            (*local_38->_vptr_cse_abstract[1])();
            ppcVar11 = local_40;
          }
          else {
            ppxVar2 = (pxVar16->super_xr_object).m_bones.
                      super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if (ppxVar2 ==
                (pxVar16->super_xr_object).m_bones.
                super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              pcVar12 = (pxVar16->m_path)._M_dataplus._M_p;
              format = "empty skeleton in %s";
            }
            else {
              pxVar9 = xray_re::xr_gamemtls_lib::get_material
                                 (this->m_gamemtls_lib,((*ppxVar2)->m_gamemtl)._M_dataplus._M_p);
              if (pxVar9 != (xr_gamemtl *)0x0) {
                iVar6 = (*(pxVar16->super_xr_object).super_xr_surface_factory.
                          _vptr_xr_surface_factory[0x16])(pxVar16);
                if ((char)iVar6 == '\0') {
                  iVar6 = (*(pxVar16->super_xr_object).super_xr_surface_factory.
                            _vptr_xr_surface_factory[0x1f])(pxVar16);
                  iVar7 = (*(pxVar16->super_xr_object).super_xr_surface_factory.
                            _vptr_xr_surface_factory[0x20])(pxVar16);
                  iVar8 = (*(pxVar16->super_xr_object).super_xr_surface_factory.
                            _vptr_xr_surface_factory[0x1b])(pxVar16);
                  uVar4 = add_texture(this,(string *)CONCAT44(extraout_var_06,iVar8),hint);
                  iVar8 = (*(pxVar16->super_xr_object).super_xr_surface_factory.
                            _vptr_xr_surface_factory[0x1c])(pxVar16);
                  uVar5 = add_shader(this,(string *)CONCAT44(extraout_var_07,iVar8),hint_00);
                  level_mesh::push(mesh,sector_idx,(xr_vbuf *)CONCAT44(extraout_var_04,iVar6),
                                   (xr_ibuf *)CONCAT44(extraout_var_05,iVar7),
                                   (fmatrix *)&local_90.field_0,uVar4,uVar5,(uint16_t)pxVar9->id);
                }
                else {
                  ppxVar3 = (pxVar16->m_children).
                            super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  for (ppxVar13 = (pxVar16->m_children).
                                  super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start; ppxVar13 != ppxVar3;
                      ppxVar13 = ppxVar13 + 1) {
                    pxVar16 = *ppxVar13;
                    iVar6 = (*(pxVar16->super_xr_object).super_xr_surface_factory.
                              _vptr_xr_surface_factory[0x1f])(pxVar16);
                    iVar7 = (*(pxVar16->super_xr_object).super_xr_surface_factory.
                              _vptr_xr_surface_factory[0x20])(pxVar16);
                    iVar8 = (*(pxVar16->super_xr_object).super_xr_surface_factory.
                              _vptr_xr_surface_factory[0x1b])(pxVar16);
                    uVar4 = add_texture(this,(string *)CONCAT44(extraout_var_01,iVar8),hint);
                    iVar8 = (*(pxVar16->super_xr_object).super_xr_surface_factory.
                              _vptr_xr_surface_factory[0x1c])(pxVar16);
                    uVar5 = add_shader(this,(string *)CONCAT44(extraout_var_02,iVar8),hint_00);
                    level_mesh::push(mesh,sector_idx,(xr_vbuf *)CONCAT44(extraout_var,iVar6),
                                     (xr_ibuf *)CONCAT44(extraout_var_00,iVar7),
                                     (fmatrix *)&local_90.field_0,uVar4,uVar5,(uint16_t)pxVar9->id);
                  }
                }
                goto LAB_001399c9;
              }
              pcVar12 = *(pointer *)
                         (**(long **)&(pxVar16->super_xr_object).m_bones.
                                      super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>
                                      ._M_impl.super__Vector_impl_data + 0x250);
              format = "can\'t resolve game material %s";
            }
            xray_re::msg(format,pcVar12);
          }
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)&pcVar1->m_s_name);
          if (iVar6 == 0) {
            pxVar16 = (xr_ogf *)0x0;
            goto LAB_001395ec;
          }
          if (ppcVar14 != ppcVar15) {
            *ppcVar14 = *ppcVar15;
          }
          ppcVar14 = ppcVar14 + 1;
        }
        ppcVar15 = ppcVar15 + 1;
      } while (ppcVar15 != ppcVar11);
      if (ppcVar14 !=
          (local_50->m_spawns).
          super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        (local_50->m_spawns).
        super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = ppcVar14;
      }
    }
  }
  return;
}

Assistant:

void level_tools::push_ext_meshes(level_mesh* mesh)
{
	if (m_level->spawn() == 0)
		return;
	const xr_gamemtl* gamemtl = m_gamemtls_lib->get_material(m_ladders_gamemtl);
	xr_assert(gamemtl);
	uint16_t clmbl_gamemtl = gamemtl->id;
	size_t texture_hint = m_textures->size() - 1;
	size_t shader_hint = m_shaders->size() - 1;
	xr_ogf_vec_cit brkbl_it = m_level->brkbl_meshes().begin();;
	xr_entity_vec& spawns = m_level->spawn()->spawns();
	xr_entity_vec_it last = spawns.begin();
	for (xr_entity_vec_it it = last, end = spawns.end(); it != end; ++it) {
		const xr_ogf* ogf;
		cse_abstract* entity = *it;
		if (entity->name() == "breakable_object") {
			ogf = *brkbl_it++;
		} else if (entity->name() == "climable_object") {
			ogf = 0;
		} else {
			if (last != it)
				*last = *it;
			++last;
			continue;
		}

		fmatrix xform;
		xform.set_xyz(entity->rotation());
		xform.c.set(entity->position());

		uint16_t sector_idx = get_sector_idx(entity->position());

		if (ogf == 0) {
			mesh->push(sector_idx, entity->shape()->shapes().front(), xform,
					0, 0, clmbl_gamemtl);
		} else {
			if (ogf->bones().empty()) {
				msg("empty skeleton in %s", ogf->path().c_str());
				goto skip;
			}
			// FIXME: what if there are many different materials?
			gamemtl = m_gamemtls_lib->get_material(ogf->bones().front()->gamemtl().c_str());
			if (gamemtl == 0) {
				msg("can't resolve game material %s", ogf->bones().front()->gamemtl().c_str());
				goto skip;
			}
			if (ogf->hierarchical()) {
				for (xr_ogf_vec_cit it1 = ogf->children().begin(),
						end1 = ogf->children().end(); it1 != end1; ++it1) {
					const xr_ogf* ogf1 = static_cast<const xr_ogf*>(*it1);
					mesh->push(sector_idx, ogf1->vb(), ogf1->ib(), xform,
							add_texture(ogf1->texture(), texture_hint),
							add_shader(ogf1->shader(), shader_hint),
							gamemtl->id);
				}
			} else {
				mesh->push(sector_idx, ogf->vb(), ogf->ib(), xform,
						add_texture(ogf->texture(), texture_hint),
						add_shader(ogf->shader(), shader_hint),
						gamemtl->id);
			}
		}
		delete entity;
skip:;
	}
	spawns.erase(last, spawns.end());
}